

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Vector<unsigned_int,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (binary<tcu::Vector<unsigned_int,_3>,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>
           *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  GLuint GVar2;
  undefined8 local_64;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  local_38 = *argument_src;
  uStack_30 = *(undefined8 *)((long)argument_src + 8);
  local_28 = *(undefined8 *)((long)argument_src + 0x10);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar2);
  local_58 = *puVar1;
  uStack_54 = puVar1[1];
  uStack_50 = puVar1[2];
  uStack_4c = puVar1[3];
  local_48 = *(undefined8 *)((long)argument_src + (ulong)GVar2 + 0x10);
  (*(code *)(this->super_binaryBase).super_functionObject.m_p_function)(&local_64);
  *(undefined4 *)((long)result_dst + 8) = local_5c;
  *(undefined8 *)result_dst = local_64;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}